

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reflex.h
# Opt level: O2

void __thiscall ClassInfo::~ClassInfo(ClassInfo *this)

{
  ~ClassInfo(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~ClassInfo(){}